

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_strategy.cpp
# Opt level: O0

vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
* __thiscall
license::hw_identifier::DefaultStrategy::alternative_ids
          (vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
           *__return_storage_ptr__,DefaultStrategy *this)

{
  bool bVar1;
  reference pLVar2;
  pointer pIVar3;
  iterator __first;
  iterator __last;
  __normal_iterator<license::hw_identifier::HwIdentifier_*,_std::vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>_>
  local_98;
  const_iterator local_90;
  undefined1 local_88 [8];
  vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  alt_ids;
  unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
  local_60;
  unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
  strategy_ptr;
  LCC_API_HW_IDENTIFICATION_STRATEGY strat_to_try;
  LCC_API_HW_IDENTIFICATION_STRATEGY it;
  iterator __end2;
  iterator __begin2;
  vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
  *__range2;
  FUNCTION_RETURN ret;
  vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
  strategy_to_try;
  DefaultStrategy *this_local;
  vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  *identifiers;
  
  strategy_to_try.
  super__Vector_base<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  available_strategies();
  std::
  vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  ::vector(__return_storage_ptr__);
  __end2 = std::
           vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
           ::begin((vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
                    *)&ret);
  _strat_to_try =
       std::
       vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
       ::end((vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
              *)&ret);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<LCC_API_HW_IDENTIFICATION_STRATEGY_*,_std::vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>_>
                                     *)&strat_to_try), bVar1) {
    pLVar2 = __gnu_cxx::
             __normal_iterator<LCC_API_HW_IDENTIFICATION_STRATEGY_*,_std::vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>_>
             ::operator*(&__end2);
    strategy_ptr._M_t.
    super___uniq_ptr_impl<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
    ._M_t.
    super__Tuple_impl<0UL,_license::hw_identifier::IdentificationStrategy_*,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
    .super__Head_base<0UL,_license::hw_identifier::IdentificationStrategy_*,_false>._M_head_impl.
    _0_4_ = *pLVar2;
    strategy_ptr._M_t.
    super___uniq_ptr_impl<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
    ._M_t.
    super__Tuple_impl<0UL,_license::hw_identifier::IdentificationStrategy_*,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
    .super__Head_base<0UL,_license::hw_identifier::IdentificationStrategy_*,_false>._M_head_impl.
    _4_4_ = (LCC_API_HW_IDENTIFICATION_STRATEGY)
            strategy_ptr._M_t.
            super___uniq_ptr_impl<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
            ._M_t.
            super__Tuple_impl<0UL,_license::hw_identifier::IdentificationStrategy_*,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
            .super__Head_base<0UL,_license::hw_identifier::IdentificationStrategy_*,_false>.
            _M_head_impl;
    IdentificationStrategy::get_strategy
              ((IdentificationStrategy *)&local_60,
               (LCC_API_HW_IDENTIFICATION_STRATEGY)
               strategy_ptr._M_t.
               super___uniq_ptr_impl<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
               ._M_t.
               super__Tuple_impl<0UL,_license::hw_identifier::IdentificationStrategy_*,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
               .super__Head_base<0UL,_license::hw_identifier::IdentificationStrategy_*,_false>.
               _M_head_impl);
    pIVar3 = std::
             unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
             ::operator->(&local_60);
    (*pIVar3->_vptr_IdentificationStrategy[4])(local_88);
    local_98._M_current =
         (HwIdentifier *)
         std::
         vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
         ::begin((vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
                  *)local_88);
    __gnu_cxx::
    __normal_iterator<license::hw_identifier::HwIdentifier_const*,std::vector<license::hw_identifier::HwIdentifier,std::allocator<license::hw_identifier::HwIdentifier>>>
    ::__normal_iterator<license::hw_identifier::HwIdentifier*>
              ((__normal_iterator<license::hw_identifier::HwIdentifier_const*,std::vector<license::hw_identifier::HwIdentifier,std::allocator<license::hw_identifier::HwIdentifier>>>
                *)&local_90,&local_98);
    __first = std::
              vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
              ::end((vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
                     *)local_88);
    __last = std::
             vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
             ::end(__return_storage_ptr__);
    std::
    vector<license::hw_identifier::HwIdentifier,std::allocator<license::hw_identifier::HwIdentifier>>
    ::
    insert<__gnu_cxx::__normal_iterator<license::hw_identifier::HwIdentifier*,std::vector<license::hw_identifier::HwIdentifier,std::allocator<license::hw_identifier::HwIdentifier>>>,void>
              ((vector<license::hw_identifier::HwIdentifier,std::allocator<license::hw_identifier::HwIdentifier>>
                *)__return_storage_ptr__,local_90,
               (__normal_iterator<license::hw_identifier::HwIdentifier_*,_std::vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>_>
                )__first._M_current,
               (__normal_iterator<license::hw_identifier::HwIdentifier_*,_std::vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>_>
                )__last._M_current);
    std::
    vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
    ::~vector((vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
               *)local_88);
    std::
    unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
    ::~unique_ptr(&local_60);
    __gnu_cxx::
    __normal_iterator<LCC_API_HW_IDENTIFICATION_STRATEGY_*,_std::vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>::
  ~vector((vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
           *)&ret);
  return __return_storage_ptr__;
}

Assistant:

std::vector<HwIdentifier> DefaultStrategy::alternative_ids() const {
	vector<LCC_API_HW_IDENTIFICATION_STRATEGY> strategy_to_try = available_strategies();
	vector<HwIdentifier> identifiers;
	FUNCTION_RETURN ret = FUNC_RET_NOT_AVAIL;
	for (auto it : strategy_to_try) {
		LCC_API_HW_IDENTIFICATION_STRATEGY strat_to_try = it;
		unique_ptr<IdentificationStrategy> strategy_ptr = IdentificationStrategy::get_strategy(strat_to_try);
		vector<HwIdentifier> alt_ids = strategy_ptr->alternative_ids();
		identifiers.insert(alt_ids.begin(), alt_ids.end(), identifiers.end());
	}
	return identifiers;
}